

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Matrix3f.cpp
# Opt level: O0

Matrix3f * Matrix3f::scaling(Matrix3f *__return_storage_ptr__,float sx,float sy,float sz)

{
  float sz_local;
  float sy_local;
  float sx_local;
  
  Matrix3f(__return_storage_ptr__,sx,0.0,0.0,0.0,sy,0.0,0.0,0.0,sz);
  return __return_storage_ptr__;
}

Assistant:

Matrix3f Matrix3f::scaling( float sx, float sy, float sz )
{
	return Matrix3f
	(
		sx, 0, 0,
		0, sy, 0,
		0, 0, sz
	);
}